

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::ReadIntoBuffer(BamStandardIndex *this,uint *bytesRequested)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IBamIODevice *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  BamException *this_00;
  stringstream s;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  CheckBufferSize(&(this->m_resources).Buffer,&this->m_bufferLength,bytesRequested);
  pIVar2 = (this->m_resources).Device;
  iVar3 = (*pIVar2->_vptr_IBamIODevice[5])(pIVar2,(this->m_resources).Buffer,(ulong)*bytesRequested)
  ;
  if (CONCAT44(extraout_var,iVar3) == (ulong)*bytesRequested) {
    return;
  }
  paVar1 = &local_1f0.field_2;
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
  std::__cxx11::stringstream::stringstream(local_1b0,(string *)&local_1f0,_S_out|_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"expected to read: ",0x12);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes, ",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"but instead read: ",0x12);
  std::ostream::_M_insert<long>((long)poVar4);
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"BamStandardIndex::ReadIntoBuffer","");
  std::__cxx11::stringbuf::str();
  BamException::BamException(this_00,&local_1f0,&local_1d0);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::ReadIntoBuffer(const unsigned int& bytesRequested) {

    // ensure that our buffer is big enough for request
    BamStandardIndex::CheckBufferSize(m_resources.Buffer, m_bufferLength, bytesRequested);

    // read from BAI file stream
    const int64_t bytesRead = m_resources.Device->Read(m_resources.Buffer, bytesRequested);
    if ( bytesRead != (int64_t)bytesRequested ) {
        stringstream s("");
        s << "expected to read: " << bytesRequested << " bytes, "
          << "but instead read: " << bytesRead;
        throw BamException("BamStandardIndex::ReadIntoBuffer", s.str());
    }
}